

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateKotlinMembers
          (ImmutableMessageGenerator *this,Printer *printer)

{
  int iVar1;
  Printer *this_00;
  bool bVar2;
  int iVar3;
  string *args_1;
  Descriptor *pDVar4;
  ImmutableMessageGenerator local_100;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  string local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  ClassNameResolver::GetKotlinFactoryName_abi_cxx11_
            (&local_38,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetKotlinExtensionsClassName_abi_cxx11_
            (&local_58,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_88,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  io::Printer::
  Print<char[15],std::__cxx11::string,char[11],std::__cxx11::string,char[8],std::__cxx11::string>
            (printer,
             "@kotlin.jvm.JvmSynthetic\npublic inline fun $camelcase_name$(block: $message_kt$.Dsl.() -> kotlin.Unit): $message$ =\n  $message_kt$.Dsl._create($message$.newBuilder()).apply { block() }._build()\n"
             ,(char (*) [15])"camelcase_name",&local_38,(char (*) [11])"message_kt",&local_58,
             (char (*) [8])0x7a970a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  this_00 = local_18;
  args_1 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[5],std::__cxx11::string>
            (this_00,"public object $name$Kt {\n",(char (*) [5])0x77db8d,args_1);
  io::Printer::Indent(local_18);
  (*(this->super_MessageGenerator)._vptr_MessageGenerator[7])(this,local_18);
  for (local_8c = 0; iVar1 = local_8c,
      iVar3 = Descriptor::nested_type_count((this->super_MessageGenerator).descriptor_),
      iVar1 < iVar3; local_8c = local_8c + 1) {
    pDVar4 = Descriptor::nested_type((this->super_MessageGenerator).descriptor_,local_8c);
    bVar2 = IsMapEntry(pDVar4);
    if (!bVar2) {
      pDVar4 = Descriptor::nested_type((this->super_MessageGenerator).descriptor_,local_8c);
      ImmutableMessageGenerator(&local_100,pDVar4,this->context_);
      GenerateKotlinMembers(&local_100,local_18);
      ~ImmutableMessageGenerator(&local_100);
    }
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print<>(local_18,"}\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateKotlinMembers(
    io::Printer* printer) const {
  printer->Print(
      "@kotlin.jvm.JvmSynthetic\n"
      "public inline fun $camelcase_name$(block: $message_kt$.Dsl.() -> "
      "kotlin.Unit): "
      "$message$ "
      "=\n"
      "  $message_kt$.Dsl._create($message$.newBuilder()).apply { block() "
      "}._build()\n",
      "camelcase_name", name_resolver_->GetKotlinFactoryName(descriptor_),
      "message_kt", name_resolver_->GetKotlinExtensionsClassName(descriptor_),
      "message", name_resolver_->GetClassName(descriptor_, true));

  printer->Print("public object $name$Kt {\n", "name", descriptor_->name());
  printer->Indent();
  GenerateKotlinDsl(printer);
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator(descriptor_->nested_type(i), context_)
        .GenerateKotlinMembers(printer);
  }
  printer->Outdent();
  printer->Print("}\n");
}